

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O1

string * __thiscall
flatbuffers::FlatBufService::name_abi_cxx11_(string *__return_storage_ptr__,FlatBufService *this)

{
  ServiceDef *pSVar1;
  pointer pcVar2;
  
  pSVar1 = this->service_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pSVar1->super_Definition).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pSVar1->super_Definition).name._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return service_->name; }